

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O1

Matrix<float> __thiscall gnns::load_from_file<float>(gnns *this,string *file_name)

{
  int iVar1;
  ostream *poVar2;
  FILE *__stream;
  ulong uVar3;
  void *pvVar4;
  runtime_error *prVar5;
  long *plVar6;
  long *plVar7;
  float *extraout_RDX;
  ulong uVar8;
  void *__ptr;
  Matrix<float> MVar9;
  int dim;
  int dim_;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"load_from_file ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(file_name->_M_dataplus)._M_p,
                      file_name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  __stream = fopen((file_name->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"File ","");
    std::operator+(&local_70,&local_50,file_name);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = (long *)*plVar6;
    plVar7 = plVar6 + 2;
    if (local_90 == plVar7) {
      local_80 = *plVar7;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(prVar5,(string *)&local_90);
    *(undefined ***)prVar5 = &PTR__runtime_error_00107d60;
    __cxa_throw(prVar5,&GnnsException::typeinfo,std::runtime_error::~runtime_error);
  }
  fread(&local_90,4,1,__stream);
  fseek(__stream,0,2);
  uVar3 = ftell(__stream);
  uVar3 = (long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
          (long)((int)local_90 * 4 + 4);
  iVar1 = (int)uVar3;
  uVar8 = 0xffffffffffffffff;
  if (-1 < iVar1 * (int)local_90) {
    uVar8 = (long)(iVar1 * (int)local_90) * 4;
  }
  pvVar4 = operator_new__(uVar8);
  fseek(__stream,0,0);
  if (0 < iVar1) {
    uVar3 = uVar3 & 0xffffffff;
    __ptr = pvVar4;
    do {
      fread(&local_70,4,1,__stream);
      if ((int)local_70._M_dataplus._M_p != (int)local_90) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"The dimensions of all rows are NOT same!\n");
        *(undefined ***)prVar5 = &PTR__runtime_error_00107d60;
        __cxa_throw(prVar5,&GnnsException::typeinfo,std::runtime_error::~runtime_error);
      }
      fread(__ptr,4,(long)(int)local_90,__stream);
      __ptr = (void *)((long)__ptr + (long)(int)local_90 * 4);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  fclose(__stream);
  *(int *)this = (int)local_90;
  *(int *)(this + 4) = iVar1;
  *(void **)(this + 8) = pvVar4;
  MVar9.data = extraout_RDX;
  MVar9._0_8_ = this;
  return MVar9;
}

Assistant:

Matrix<T> load_from_file(const std::string& file_name)
    {
        std::cout << "load_from_file " << file_name << std::endl;

        FILE *fp = fopen(file_name.c_str(), "rb");

        if (fp == NULL)
        {
            throw GnnsException(std::string("File ") + file_name + "is NOT exist!\n");
        }

        //read the vector dimension
        int dim;
        fread(&dim, 4, 1, fp);

        int col_size = 1 * 4 + sizeof(T) * dim;
        fseek(fp, 0, SEEK_END);
        int col = int(ftell(fp)) / col_size;

        //allocate memory for the vectors
        try {
            T* vecs = new T[dim * col];
            fseek(fp, 0, SEEK_SET);
            for (int i = 0; i < col; ++i)
            {
                int dim_;
                fread(&dim_, 4, 1, fp);
                if (dim_ != dim)
                {
                    throw GnnsException("The dimensions of all rows are NOT same!\n");
                }
                fread(vecs + i * dim, sizeof(T), dim, fp);
            }
            fclose(fp);

            return Matrix<T>(vecs, col, dim);
        } catch (const std::bad_alloc &ba) {
            throw ba;
        }
    }